

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O2

void __thiscall
irr::core::array<irr::scene::ISkinnedMesh::SPositionKey>::erase
          (array<irr::scene::ISkinnedMesh::SPositionKey> *this,u32 index,s32 count)

{
  pointer pSVar1;
  const_iterator __first;
  int iVar2;
  ulong uVar3;
  
  if (0 < count) {
    pSVar1 = (this->m_data).
             super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(this->m_data).
                  super__Vector_base<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4;
    if (index < uVar3) {
      iVar2 = (int)uVar3 - index;
      if (count <= iVar2) {
        iVar2 = count;
      }
      __first._M_current = pSVar1 + index;
      ::std::
      vector<irr::scene::ISkinnedMesh::SPositionKey,_std::allocator<irr::scene::ISkinnedMesh::SPositionKey>_>
      ::erase(&this->m_data,__first,__first._M_current + iVar2);
      return;
    }
  }
  return;
}

Assistant:

void erase(u32 index, s32 count)
	{
		if (index >= m_data.size() || count < 1)
			return;
		count = core::min_(count, (s32)m_data.size() - (s32)index);
		auto first = std::next(m_data.begin(), index);
		auto last = std::next(first, count);
		m_data.erase(first, last);
	}